

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

void __thiscall Cpu::reset(Cpu *this)

{
  memset(this,0,0x106);
  memset(this->SRAM,0,0x20000);
  this->cycle = 0;
  this->cycle2 = 0;
  this->prescaler = 0;
  this->sp = this->Stack;
  this->pc = 0xfff;
  this->mode = '\0';
  return;
}

Assistant:

void Cpu::reset()
{
	memset (RAM, 0, 262);
	memset (SRAM, 0, 131072*sizeof(unsigned char));
	cycle = 0;
	cycle2 = 0;
	prescaler = 0;
	sp = Stack;
	pc = 0xfff;
	mode = 0;
}